

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

any cs_impl::any::make_protect<cs::object_method,cs_impl::any_const&,cs_impl::any&,bool>
              (any *args,any *args_1,bool *args_2)

{
  holder<cs::object_method> *args_1_00;
  proxy *dat;
  allocator_type<cs_impl::any::proxy,_512UL,_cs_impl::default_allocator_provider> *in_RCX;
  proxy *in_RDI;
  proxy *args_2_00;
  any *in_stack_ffffffffffffffd0;
  undefined4 uVar1;
  undefined4 uVar2;
  
  uVar2 = 1;
  uVar1 = 1;
  args_2_00 = in_RDI;
  args_1_00 = cs::
              allocator_type<cs_impl::any::holder<cs::object_method>,64ul,cs_impl::default_allocator_provider>
              ::alloc<cs_impl::any_const&,cs_impl::any&,bool>
                        ((allocator_type<cs_impl::any::holder<cs::object_method>,_64UL,_cs_impl::default_allocator_provider>
                          *)in_RCX,(any *)0x100000001,in_stack_ffffffffffffffd0,&in_RDI->is_rvalue);
  dat = cs::allocator_type<cs_impl::any::proxy,512ul,cs_impl::default_allocator_provider>::
        alloc<int,int,cs_impl::any::holder<cs::object_method>*>
                  (in_RCX,(int *)CONCAT44(uVar2,uVar1),(int *)args_1_00,
                   (holder<cs::object_method> **)args_2_00);
  any((any *)in_RDI,dat);
  return (any)args_2_00;
}

Assistant:

static any make_protect(ArgsT &&...args)
		{
			return any(allocator.alloc(1, 1, holder<T>::allocator.alloc(std::forward<ArgsT>(args)...)));
		}